

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O2

uint __thiscall RegVmLoweredModule::FindConstant(RegVmLoweredModule *this,uint value1,uint value2)

{
  uint *puVar1;
  uint index;
  
  index = 1;
  while( true ) {
    if ((this->constants).count <= index) {
      return 0;
    }
    puVar1 = SmallArray<unsigned_int,_256U>::operator[](&this->constants,index - 1);
    if ((*puVar1 == value1) &&
       (puVar1 = SmallArray<unsigned_int,_256U>::operator[](&this->constants,index),
       *puVar1 == value2)) break;
    index = index + 2;
  }
  return index;
}

Assistant:

unsigned RegVmLoweredModule::FindConstant(unsigned value1, unsigned value2)
{
	for(unsigned i = 0; i + 1 < constants.size(); i += 2)
	{
		if(constants[i] == value1 && constants[i + 1] == value2)
			return i + 1;
	}

	return 0;
}